

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillRightConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Point *pPVar2;
  Point *pPVar3;
  double dVar4;
  
  while( true ) {
    Fill(this,tcx,node->next);
    pPVar2 = node->next->point;
    pPVar3 = edge->p;
    if (pPVar2 == pPVar3) {
      return;
    }
    dVar4 = (pPVar2->y - pPVar3->y) * (edge->q->x - pPVar3->x) -
            (pPVar2->x - pPVar3->x) * (edge->q->y - pPVar3->y);
    if (ABS(dVar4) < 1e-12) {
      return;
    }
    if (dVar4 <= 0.0) {
      return;
    }
    pPVar3 = node->next->next->point;
    dVar4 = pPVar3->x;
    dVar1 = pPVar3->y;
    dVar4 = (pPVar2->y - dVar1) * (node->point->x - dVar4) -
            (pPVar2->x - dVar4) * (node->point->y - dVar1);
    if (ABS(dVar4) < 1e-12) break;
    if (dVar4 <= 0.0) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillRightConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.next);
  if (node.next->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.next->point, *edge->p) == CCW) {
      // Below
      if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
        // Next is concave
        FillRightConcaveEdgeEvent(tcx, edge, node);
      } else {
        // Next is convex
      }
    }
  }

}